

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_navxythetalat.cpp
# Opt level: O3

int __thiscall
EnvironmentNAVXYTHETALAT::SetStart
          (EnvironmentNAVXYTHETALAT *this,double x_m,double y_m,double theta_rad)

{
  double dVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  code *pcVar6;
  long *plVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  uint uVar10;
  int iVar11;
  
  auVar8._8_8_ = y_m;
  auVar8._0_8_ = x_m;
  dVar1 = (this->super_EnvironmentNAVXYTHETALATTICE).EnvNAVXYTHETALATCfg.cellsize_m;
  auVar9._8_8_ = dVar1;
  auVar9._0_8_ = dVar1;
  auVar9 = divpd(auVar8,auVar9);
  uVar10 = (int)auVar9._0_8_ - (uint)(x_m < 0.0);
  iVar11 = (int)auVar9._8_8_ - (uint)(y_m < 0.0);
  uVar2 = (*(this->super_EnvironmentNAVXYTHETALATTICE).super_DiscreteSpaceInformation.
            _vptr_DiscreteSpaceInformation[0x21])();
  iVar3 = (*(this->super_EnvironmentNAVXYTHETALATTICE).super_DiscreteSpaceInformation.
            _vptr_DiscreteSpaceInformation[0x32])(this,(ulong)uVar10,iVar11);
  iVar4 = -1;
  if ((char)iVar3 != '\0') {
    (*(this->super_EnvironmentNAVXYTHETALATTICE).super_DiscreteSpaceInformation.
      _vptr_DiscreteSpaceInformation[0x2c])(this,(ulong)uVar10,iVar11,(ulong)uVar2);
    pcVar6 = (code *)this->GetHashEntry;
    plVar7 = (long *)((long)&(this->super_EnvironmentNAVXYTHETALATTICE).
                             super_DiscreteSpaceInformation._vptr_DiscreteSpaceInformation +
                     *(long *)&this->field_0x1c8);
    if (((ulong)pcVar6 & 1) != 0) {
      pcVar6 = *(code **)(pcVar6 + *plVar7 + -1);
    }
    piVar5 = (int *)(*pcVar6)(plVar7,uVar10,iVar11,uVar2);
    if (piVar5 == (int *)0x0) {
      pcVar6 = (code *)this->CreateNewHashEntry;
      plVar7 = (long *)((long)&(this->super_EnvironmentNAVXYTHETALATTICE).
                               super_DiscreteSpaceInformation._vptr_DiscreteSpaceInformation +
                       *(long *)&this->field_0x1d8);
      if (((ulong)pcVar6 & 1) != 0) {
        pcVar6 = *(code **)(pcVar6 + *plVar7 + -1);
      }
      piVar5 = (int *)(*pcVar6)(plVar7,uVar10,iVar11,uVar2);
    }
    iVar4 = *piVar5;
    if ((this->super_EnvironmentNAVXYTHETALATTICE).EnvNAVXYTHETALAT.startstateid != iVar4) {
      (this->super_EnvironmentNAVXYTHETALATTICE).bNeedtoRecomputeStartHeuristics = true;
      (this->super_EnvironmentNAVXYTHETALATTICE).bNeedtoRecomputeGoalHeuristics = true;
    }
    (this->super_EnvironmentNAVXYTHETALATTICE).EnvNAVXYTHETALAT.startstateid = iVar4;
    (this->super_EnvironmentNAVXYTHETALATTICE).EnvNAVXYTHETALATCfg.StartX_c = uVar10;
    (this->super_EnvironmentNAVXYTHETALATTICE).EnvNAVXYTHETALATCfg.StartY_c = iVar11;
    (this->super_EnvironmentNAVXYTHETALATTICE).EnvNAVXYTHETALATCfg.StartTheta = uVar2;
  }
  return iVar4;
}

Assistant:

int EnvironmentNAVXYTHETALAT::SetStart(double x_m, double y_m, double theta_rad)
{
    int x = CONTXY2DISC(x_m, EnvNAVXYTHETALATCfg.cellsize_m);
    int y = CONTXY2DISC(y_m, EnvNAVXYTHETALATCfg.cellsize_m);
    int theta = ContTheta2DiscNew(theta_rad);

    if (!IsWithinMapCell(x, y)) {
        SBPL_ERROR("ERROR: trying to set a start cell %d %d that is outside of map\n", x, y);
        return -1;
    }

    SBPL_PRINTF("env: setting start to %.3f %.3f %.3f (%d %d %d)\n", x_m, y_m, theta_rad, x, y, theta);

    if (!IsValidConfiguration(x, y, theta)) {
        SBPL_PRINTF("WARNING: start configuration %d %d %d is invalid\n", x, y, theta);
    }

    EnvNAVXYTHETALATHashEntry_t* OutHashEntry;
    if ((OutHashEntry = (this->*GetHashEntry)(x, y, theta)) == NULL) {
        // have to create a new entry
        OutHashEntry = (this->*CreateNewHashEntry)(x, y, theta);
    }

    // need to recompute start heuristics?
    if (EnvNAVXYTHETALAT.startstateid != OutHashEntry->stateID) {
        bNeedtoRecomputeStartHeuristics = true;
        // because termination condition can be not all states TODO - make it dependent on term. condition
        bNeedtoRecomputeGoalHeuristics = true;
    }

    // set start
    EnvNAVXYTHETALAT.startstateid = OutHashEntry->stateID;
    EnvNAVXYTHETALATCfg.StartX_c = x;
    EnvNAVXYTHETALATCfg.StartY_c = y;
    EnvNAVXYTHETALATCfg.StartTheta = theta;

    return EnvNAVXYTHETALAT.startstateid;
}